

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall ncnn::Interp::load_param(Interp *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  int local_4;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xb8) = iVar1;
  fVar2 = ParamDict::get(in_RSI,1,1.0);
  *(float *)(in_RDI + 0xc0) = fVar2;
  fVar2 = ParamDict::get(in_RSI,2,1.0);
  *(float *)(in_RDI + 0xbc) = fVar2;
  iVar1 = ParamDict::get(in_RSI,3,0);
  *(int *)(in_RDI + 200) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,0);
  *(int *)(in_RDI + 0xc4) = iVar1;
  if ((*(int *)(in_RDI + 0xb8) < 1) || (3 < *(int *)(in_RDI + 0xb8))) {
    fprintf(_stderr,"unsupported resize type %d\n",(ulong)*(uint *)(in_RDI + 0xb8));
    local_4 = -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Interp::load_param(const ParamDict& pd)
{
    resize_type = pd.get(0, 0);
    height_scale = pd.get(1, 1.f);
    width_scale = pd.get(2, 1.f);
    output_height = pd.get(3, 0);
    output_width = pd.get(4, 0);

    if (resize_type < 1 || resize_type > 3)
    {
        fprintf(stderr, "unsupported resize type %d\n", resize_type);
        return -1;
    }

    return 0;
}